

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O0

void __thiscall LSM_tree::recover(LSM_tree *this)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  Level *this_00;
  ostream *poVar4;
  Sstable *pSVar5;
  streamoff sVar6;
  pairs *this_01;
  reference ppSVar7;
  undefined1 auVar8 [16];
  pairs *local_3b0;
  pairs *my_pair;
  undefined8 local_3a0;
  undefined4 local_394;
  undefined1 auStack_390 [4];
  int o4_1;
  undefined8 local_388;
  undefined4 local_37c;
  undefined1 auStack_378 [4];
  int o3;
  undefined8 local_370;
  undefined4 local_364;
  undefined1 auStack_360 [4];
  int o2;
  undefined8 local_358;
  undefined4 local_34c;
  undefined1 auStack_348 [4];
  int o1;
  undefined8 local_340;
  undefined4 local_338;
  byte local_331;
  int o0;
  int iStack_32c;
  bool del;
  uint my_timer;
  uint offset;
  uint64_t key;
  undefined8 local_318;
  undefined4 local_30c;
  undefined1 auStack_308 [4];
  int o6;
  undefined8 local_300;
  undefined4 local_2f4;
  undefined1 auStack_2f0 [4];
  int o5;
  undefined8 local_2e8;
  undefined4 local_2dc;
  Sstable *pSStack_2d8;
  int o4;
  Sstable *my_sstable;
  ifstream in;
  path local_c8;
  undefined1 local_a0 [8];
  string file_name;
  Level *pLStack_78;
  int file_id;
  Level *my_level;
  path local_60;
  undefined1 local_38 [8];
  string level_name;
  int level_id;
  LSM_tree *this_local;
  
  level_name.field_2._12_4_ = 0;
  do {
    get_level_name_abi_cxx11_((string *)local_38,this,level_name.field_2._12_4_);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_60,(string *)local_38,auto_format);
    bVar1 = std::filesystem::exists(&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (Level *)operator_new(0x28);
      Level::Level(this_00,level_name.field_2._12_4_);
      pLStack_78 = this_00;
      std::vector<Level_*,_std::allocator<Level_*>_>::push_back
                (&this->disk,&stack0xffffffffffffff88);
      for (file_name.field_2._12_4_ = 0;
          (int)file_name.field_2._12_4_ < 1 << ((char)level_name.field_2._12_4_ + 1U & 0x1f);
          file_name.field_2._12_4_ = file_name.field_2._12_4_ + 1) {
        get_file_name_abi_cxx11_
                  ((string *)local_a0,this,level_name.field_2._12_4_,file_name.field_2._12_4_);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   auto_format);
        bVar1 = std::filesystem::exists(&local_c8);
        std::filesystem::__cxx11::path::~path(&local_c8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pLStack_78->is_creat[(int)file_name.field_2._12_4_] = true;
          _Var3 = std::operator|(_S_in,_S_bin);
          std::ifstream::ifstream(&my_sstable,(string *)local_a0,_Var3);
          bVar2 = std::ifstream::is_open();
          if ((bVar2 & 1) == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Error:open file");
            poVar4 = std::operator<<(poVar4,(string *)local_a0);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            exit(0);
          }
          pSVar5 = (Sstable *)operator_new(0x20);
          Sstable::Sstable(pSVar5);
          pSStack_2d8 = pSVar5;
          std::istream::seekg((long)&my_sstable,0x200000);
          auVar8 = std::istream::tellg();
          _auStack_2f0 = auVar8;
          sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_2f0);
          local_2dc = (undefined4)sVar6;
          std::istream::read((char *)&my_sstable,(long)pSStack_2d8);
          auVar8 = std::istream::tellg();
          _auStack_308 = auVar8;
          sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_308);
          local_2f4 = (undefined4)sVar6;
          std::istream::seekg((long)&my_sstable,0x200004);
          auVar8 = std::istream::tellg();
          local_318 = auVar8._8_8_;
          key = auVar8._0_8_;
          sVar6 = std::fpos::operator_cast_to_long((fpos *)&key);
          local_30c = (undefined4)sVar6;
          while( true ) {
            bVar2 = std::ios::eof();
            if (((bVar2 ^ 0xff) & 1) == 0) break;
            auVar8 = std::istream::tellg();
            _auStack_348 = auVar8;
            sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_348);
            local_338 = (undefined4)sVar6;
            std::istream::read((char *)&my_sstable,(long)&my_timer);
            auVar8 = std::istream::tellg();
            _auStack_360 = auVar8;
            sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_360);
            local_34c = (undefined4)sVar6;
            std::istream::read((char *)&my_sstable,(long)&stack0xfffffffffffffcd4);
            auVar8 = std::istream::tellg();
            _auStack_378 = auVar8;
            sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_378);
            local_364 = (undefined4)sVar6;
            std::istream::read((char *)&my_sstable,(long)&o0);
            auVar8 = std::istream::tellg();
            _auStack_390 = auVar8;
            sVar6 = std::fpos::operator_cast_to_long((fpos *)auStack_390);
            local_37c = (undefined4)sVar6;
            std::istream::read((char *)&my_sstable,(long)&local_331);
            auVar8 = std::istream::tellg();
            local_3a0 = auVar8._8_8_;
            my_pair = auVar8._0_8_;
            sVar6 = std::fpos::operator_cast_to_long((fpos *)&my_pair);
            local_394 = (undefined4)sVar6;
            this_01 = (pairs *)operator_new(0x18);
            pairs::pairs(this_01,_my_timer,iStack_32c,(ulong)(uint)o0,(bool)(local_331 & 1));
            local_3b0 = this_01;
            std::vector<pairs_*,_std::allocator<pairs_*>_>::push_back
                      (&pSStack_2d8->buffer,&local_3b0);
          }
          std::ifstream::close();
          pSVar5 = pSStack_2d8;
          ppSVar7 = std::vector<Sstable_*,_std::allocator<Sstable_*>_>::operator[]
                              (&pLStack_78->file,(long)(int)file_name.field_2._12_4_);
          *ppSVar7 = pSVar5;
          std::ifstream::~ifstream(&my_sstable);
          my_level._0_4_ = 0;
        }
        else {
          pLStack_78->is_creat[(int)file_name.field_2._12_4_] = false;
          my_level._0_4_ = 6;
        }
        std::__cxx11::string::~string((string *)local_a0);
      }
      level_name.field_2._12_4_ = level_name.field_2._12_4_ + 1;
      my_level._0_4_ = 0;
    }
    else {
      my_level._0_4_ = 3;
    }
    std::__cxx11::string::~string((string *)local_38);
  } while ((int)my_level == 0);
  std::operator<<((ostream *)&std::cout,"recover finished\n");
  return;
}

Assistant:

void LSM_tree::recover() {
    int level_id=0;


    while(true)
    {
        std::string level_name=get_level_name(level_id);
        if(!fs::exists(level_name)) break;
        Level* my_level=new Level(level_id);
        disk.push_back(my_level);

        //看看这层由上面文件 读一下
        for(int file_id=0;file_id<(1<<(level_id+1));file_id++)
        {
            std::string file_name=get_file_name(level_id,file_id);
            //如果这个文件存在 就都进去
            if(!fs::exists(file_name)){
                my_level->is_creat[file_id]=false;
                continue;
            }
            else my_level->is_creat[file_id]=true;

            //打开文件
            ifstream in(file_name, ios::in | ios::binary);
            if (!in.is_open()) {
                cout << "Error:open file" << file_name << endl;
                exit(0);
            }

            //新建索引区
            Sstable * my_sstable =new Sstable;
            //找到索引区起始位置
            in.seekg(INDEX_BEGIN,ios::beg);
            int o4=in.tellg();
            in.read((char*)&my_sstable->end, sizeof(unsigned int));
           int o5=in.tellg();
            in.seekg(INDEX_BEGIN+ sizeof(unsigned int),ios::beg);
            int o6=in.tellg();
            while (!in.eof())
            {
                uint64_t key;
                unsigned int offset;
                unsigned int my_timer;
                bool del;

                int o0=in.tellg();
                in.read((char*)&key,sizeof(uint64_t));
                int o1=in.tellg();
                in.read((char*)&offset,sizeof(unsigned int));
                int o2=in.tellg();
                in.read((char*)&my_timer, sizeof(unsigned int));
                int o3=in.tellg();
                in.read((char*)&del,sizeof(bool));
                int o4=in.tellg();

                pairs* my_pair=new pairs(key,offset,my_timer,del);
                my_sstable->buffer.push_back(my_pair);
            }
            in.close();

            //把sstable写进level
            my_level->file[file_id]=my_sstable;



        }
        level_id++;

    }

    cout<<"recover finished\n";

}